

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDesc *Member)

{
  char *pcVar1;
  char *local_58;
  char *local_38;
  uint local_20;
  allocator local_1a;
  allocator local_19;
  Uint32 i;
  ShaderCodeVariableDesc *Member_local;
  ShaderCodeVariableDescX *this_local;
  
  _i = Member;
  Member_local = &this->super_ShaderCodeVariableDesc;
  memcpy(this,Member,0x28);
  if (_i->Name == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = _i->Name;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->NameCopy,local_38,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  if (_i->TypeName == (char *)0x0) {
    local_58 = "";
  }
  else {
    local_58 = _i->TypeName;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->TypeNameCopy,local_58,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::vector(&this->Members);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).Name = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar1;
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::reserve(&this->Members,(ulong)_i->NumMembers);
  for (local_20 = 0; local_20 < _i->NumMembers; local_20 = local_20 + 1) {
    AddMember(this,_i->pMembers + local_20);
  }
  return;
}

Assistant:

ShaderCodeVariableDescX(const ShaderCodeVariableDesc& Member) noexcept :
        ShaderCodeVariableDesc{Member},
        // clang-format off
        NameCopy    {Member.Name     != nullptr ? Member.Name     : ""},
        TypeNameCopy{Member.TypeName != nullptr ? Member.TypeName : ""}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();

        Members.reserve(Member.NumMembers);
        for (Uint32 i = 0; i < Member.NumMembers; ++i)
            AddMember(Member.pMembers[i]);
    }